

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

int testCrypto(void)

{
  bool_t bVar1;
  bool_t bVar2;
  bool_t bVar3;
  bool_t bVar4;
  bool_t bVar5;
  bool_t bVar6;
  bool_t bVar7;
  bool_t bVar8;
  bool_t bVar9;
  bool_t bVar10;
  bool_t bVar11;
  bool_t bVar12;
  bool_t bVar13;
  bool_t bVar14;
  bool_t bVar15;
  bool_t bVar16;
  char *pcVar17;
  int ret;
  bool_t code;
  
  bVar1 = beltTest();
  pcVar17 = "Err";
  if (bVar1 != 0) {
    pcVar17 = "OK";
  }
  printf("beltTest: %s\n",pcVar17);
  bVar2 = bashTest();
  pcVar17 = "Err";
  if (bVar2 != 0) {
    pcVar17 = "OK";
  }
  printf("bashTest: %s\n",pcVar17);
  bVar3 = beltBench();
  bVar4 = bashBench();
  bVar5 = bignTest();
  pcVar17 = "Err";
  if (bVar5 != 0) {
    pcVar17 = "OK";
  }
  printf("bignTest: %s\n",pcVar17);
  bVar6 = bign96Test();
  pcVar17 = "Err";
  if (bVar6 != 0) {
    pcVar17 = "OK";
  }
  printf("bign96Test: %s\n",pcVar17);
  bVar7 = botpTest();
  pcVar17 = "Err";
  if (bVar7 != 0) {
    pcVar17 = "OK";
  }
  printf("botpTest: %s\n",pcVar17);
  bVar8 = brngTest();
  pcVar17 = "Err";
  if (bVar8 != 0) {
    pcVar17 = "OK";
  }
  printf("brngTest: %s\n",pcVar17);
  bVar9 = belsTest();
  pcVar17 = "Err";
  if (bVar9 != 0) {
    pcVar17 = "OK";
  }
  printf("belsTest: %s\n",pcVar17);
  bVar10 = bakeTest();
  pcVar17 = "Err";
  if (bVar10 != 0) {
    pcVar17 = "OK";
  }
  printf("bakeTest: %s\n",pcVar17);
  bVar11 = bpkiTest();
  pcVar17 = "Err";
  if (bVar11 != 0) {
    pcVar17 = "OK";
  }
  printf("bpkiTest: %s\n",pcVar17);
  bVar12 = btokTest();
  pcVar17 = "Err";
  if (bVar12 != 0) {
    pcVar17 = "OK";
  }
  printf("btokTest: %s\n",pcVar17);
  bVar13 = dstuTest();
  pcVar17 = "Err";
  if (bVar13 != 0) {
    pcVar17 = "OK";
  }
  printf("dstuTest: %s\n",pcVar17);
  bVar14 = g12sTest();
  pcVar17 = "Err";
  if (bVar14 != 0) {
    pcVar17 = "OK";
  }
  printf("g12sTest: %s\n",pcVar17);
  bVar15 = pfokTest();
  pcVar17 = "Err";
  if (bVar15 != 0) {
    pcVar17 = "OK";
  }
  printf("pfokTest: %s\n",pcVar17);
  bVar16 = stb99Test();
  pcVar17 = "Err";
  if (bVar16 != 0) {
    pcVar17 = "OK";
  }
  printf("stb99Test: %s\n",pcVar17);
  return (uint)(byte)((bVar16 != 0 ^ 0xffU) & 1 |
                     (bVar15 != 0 ^ 0xffU) & 1 |
                     (bVar14 != 0 ^ 0xffU) & 1 |
                     (bVar13 != 0 ^ 0xffU) & 1 |
                     (bVar12 != 0 ^ 0xffU) & 1 |
                     (bVar11 != 0 ^ 0xffU) & 1 |
                     (bVar10 != 0 ^ 0xffU) & 1 |
                     (bVar9 != 0 ^ 0xffU) & 1 |
                     (bVar8 != 0 ^ 0xffU) & 1 |
                     (bVar7 != 0 ^ 0xffU) & 1 |
                     (bVar6 != 0 ^ 0xffU) & 1 |
                     (bVar5 != 0 ^ 0xffU) & 1 |
                     (bVar4 != 0 ^ 0xffU) & 1 |
                     (bVar3 != 0 ^ 0xffU) & 1 | (bVar2 != 0 ^ 0xffU) & 1 | (bVar1 != 0 ^ 0xffU) & 1)
  ;
}

Assistant:

int testCrypto()
{
	bool_t code;
	int ret = 0;
	printf("beltTest: %s\n", (code = beltTest()) ? "OK" : "Err"), ret |= !code;
	printf("bashTest: %s\n", (code = bashTest()) ? "OK" : "Err"), ret |= !code;
	code = beltBench(), ret |= !code;
	code = bashBench(), ret |= !code;
	printf("bignTest: %s\n", (code = bignTest()) ? "OK" : "Err"), ret |= !code;
	printf("bign96Test: %s\n", (code = bign96Test()) ? "OK" : "Err"),
		ret |= !code;
	printf("botpTest: %s\n", (code = botpTest()) ? "OK" : "Err"), ret |= !code;
	printf("brngTest: %s\n", (code = brngTest()) ? "OK" : "Err"), ret |= !code;
	printf("belsTest: %s\n", (code = belsTest()) ? "OK" : "Err"), ret |= !code;
	printf("bakeTest: %s\n", (code = bakeTest()) ? "OK" : "Err"), ret |= !code;
	printf("bpkiTest: %s\n", (code = bpkiTest()) ? "OK" : "Err"), ret |= !code;
	printf("btokTest: %s\n", (code = btokTest()) ? "OK" : "Err"), ret |= !code;
	printf("dstuTest: %s\n", (code = dstuTest()) ? "OK" : "Err"), ret |= !code;
	printf("g12sTest: %s\n", (code = g12sTest()) ? "OK" : "Err"), ret |= !code;
	printf("pfokTest: %s\n", (code = pfokTest()) ? "OK" : "Err"), ret |= !code;
	printf("stb99Test: %s\n", (code = stb99Test()) ? "OK" : "Err"),
		ret |= !code;
	return ret;
}